

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publickey.c
# Opt level: O0

int publickey_response_id(uchar **pdata,size_t data_len)

{
  uint32_t uVar1;
  int iVar2;
  ulong __n;
  uchar *puVar3;
  LIBSSH2_PUBLICKEY_CODE_LIST *local_38;
  LIBSSH2_PUBLICKEY_CODE_LIST *codes;
  uchar *data;
  size_t response_len;
  size_t data_len_local;
  uchar **pdata_local;
  
  puVar3 = *pdata;
  local_38 = publickey_response_codes;
  if (3 < data_len) {
    uVar1 = _libssh2_ntohu32(puVar3);
    __n = (ulong)uVar1;
    puVar3 = puVar3 + 4;
    if (__n <= data_len - 4) {
      for (; local_38->name != (char *)0x0; local_38 = local_38 + 1) {
        if (((long)local_38->name_len == __n) &&
           (iVar2 = strncmp(local_38->name,(char *)puVar3,__n), iVar2 == 0)) {
          *pdata = puVar3 + __n;
          return local_38->code;
        }
      }
    }
  }
  return -1;
}

Assistant:

static int
publickey_response_id(unsigned char **pdata, size_t data_len)
{
    size_t response_len;
    unsigned char *data = *pdata;
    const LIBSSH2_PUBLICKEY_CODE_LIST *codes = publickey_response_codes;

    if(data_len < 4) {
        /* Malformed response */
        return -1;
    }
    response_len = _libssh2_ntohu32(data);
    data += 4;
    data_len -= 4;
    if(data_len < response_len) {
        /* Malformed response */
        return -1;
    }

    while(codes->name) {
        if((unsigned long)codes->name_len == response_len &&
            strncmp(codes->name, (char *) data, response_len) == 0) {
            *pdata = data + response_len;
            return codes->code;
        }
        codes++;
    }

    return -1;
}